

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_mount_internal(char *args,MountType mnttype)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  int *piVar6;
  undefined8 uVar7;
  size_t __size;
  void *__ptr;
  size_t sVar8;
  
  if (*args == '\"') {
    args = args + 1;
    pcVar3 = strchr(args,0x22);
    if (pcVar3 != (char *)0x0) goto LAB_001051ea;
LAB_00105209:
    pcVar3 = "missing string terminator in argument.";
  }
  else {
    pcVar3 = strchr(args,0x20);
LAB_001051ea:
    *pcVar3 = '\0';
    if (pcVar3[1] == '\"') {
      pcVar3 = pcVar3 + 2;
      pcVar4 = strchr(pcVar3,0x22);
      if (pcVar4 == (char *)0x0) goto LAB_00105209;
    }
    else {
      pcVar3 = pcVar3 + 1;
      pcVar4 = strchr(pcVar3,0x20);
    }
    *pcVar4 = '\0';
    iVar1 = atoi(pcVar4 + 1);
    if (mnttype == MNTTYPE_HANDLE) {
      lVar5 = PHYSFS_openRead(args);
      if (lVar5 == 0) {
        pcVar3 = (char *)PHYSFS_getLastError();
        pcVar4 = "PHYSFS_openRead(\'%s\') failed. reason: %s.\n";
LAB_0010531a:
        iVar1 = printf(pcVar4,args,pcVar3);
        return iVar1;
      }
      iVar1 = PHYSFS_mountHandle(lVar5,args,pcVar3,iVar1);
      if (iVar1 == 0) {
        PHYSFS_close(lVar5);
        goto LAB_0010533d;
      }
    }
    else {
      if (mnttype == MNTTYPE_PATH) {
        iVar1 = PHYSFS_mount(args,pcVar3,iVar1);
      }
      else {
        __stream = fopen(args,"rb");
        if (__stream == (FILE *)0x0) {
          piVar6 = __errno_location();
          pcVar3 = strerror(*piVar6);
          pcVar4 = "Failed to open %s to read into memory: %s.\n";
          goto LAB_0010531a;
        }
        iVar2 = fseek(__stream,0,2);
        if ((iVar2 != 0) || (__size = ftell(__stream), (long)__size < 0)) {
          piVar6 = __errno_location();
          pcVar3 = strerror(*piVar6);
          pcVar4 = "Failed to find size of %s to read into memory: %s.\n";
LAB_001052d6:
          printf(pcVar4,args,pcVar3);
          iVar1 = fclose(__stream);
          return iVar1;
        }
        __ptr = malloc(__size);
        if (__ptr == (void *)0x0) {
          piVar6 = __errno_location();
          pcVar3 = strerror(*piVar6);
          pcVar4 = "Failed to allocate space to read %s into memory: %s.\n";
          goto LAB_001052d6;
        }
        iVar2 = fseek(__stream,0,0);
        if ((iVar2 != 0) || (sVar8 = fread(__ptr,__size,1,__stream), sVar8 != 1)) {
          piVar6 = __errno_location();
          pcVar3 = strerror(*piVar6);
          printf("Failed to read %s into memory: %s.\n",args,pcVar3);
          fclose(__stream);
          free(__ptr);
          return extraout_EAX;
        }
        fclose(__stream);
        iVar1 = PHYSFS_mountMemory(__ptr,__size,freeBuf,args,pcVar3,iVar1);
      }
      if (iVar1 == 0) {
LAB_0010533d:
        uVar7 = PHYSFS_getLastError();
        iVar1 = printf("Failure. reason: %s.\n",uVar7);
        return iVar1;
      }
    }
    pcVar3 = "Successful.";
  }
  iVar1 = puts(pcVar3);
  return iVar1;
}

Assistant:

static int cmd_mount_internal(char *args, const MountType mnttype)
{
    char *ptr;
    char *mntpoint = NULL;
    int appending = 0;
    int rc = 0;

    if (*args == '\"')
    {
        args++;
        ptr = strchr(args, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(args, ' ');
        *ptr = '\0';
    } /* else */

    mntpoint = ptr + 1;
    if (*mntpoint == '\"')
    {
        mntpoint++;
        ptr = strchr(mntpoint, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(mntpoint, ' ');
        *(ptr) = '\0';
    } /* else */
    appending = atoi(ptr + 1);

    /*printf("[%s], [%s], [%d]\n", args, mntpoint, appending);*/

    if (mnttype == MNTTYPE_PATH)
        rc = PHYSFS_mount(args, mntpoint, appending);

    else if (mnttype == MNTTYPE_HANDLE)
    {
        PHYSFS_File *f = PHYSFS_openRead(args);
        if (f == NULL)
        {
            printf("PHYSFS_openRead('%s') failed. reason: %s.\n", args, PHYSFS_getLastError());
            return 1;
        } /* if */

        rc = PHYSFS_mountHandle(f, args, mntpoint, appending);
        if (!rc)
            PHYSFS_close(f);
    } /* else if */

    else if (mnttype == MNTTYPE_MEMORY)
    {
        FILE *in = fopen(args, "rb");
        void *buf = NULL;
        long len = 0;

        if (in == NULL)
        {
            printf("Failed to open %s to read into memory: %s.\n", args, strerror(errno));
            return 1;
        } /* if */

        if ( (fseek(in, 0, SEEK_END) != 0) || ((len = ftell(in)) < 0) )
        {
            printf("Failed to find size of %s to read into memory: %s.\n", args, strerror(errno));
            fclose(in);
            return 1;
        } /* if */

        buf = malloc(len);
        if (buf == NULL)
        {
            printf("Failed to allocate space to read %s into memory: %s.\n", args, strerror(errno));
            fclose(in);
            return 1;
        } /* if */

        if ((fseek(in, 0, SEEK_SET) != 0) || (fread(buf, len, 1, in) != 1))
        {
            printf("Failed to read %s into memory: %s.\n", args, strerror(errno));
            fclose(in);
            free(buf);
            return 1;
        } /* if */

        fclose(in);

        rc = PHYSFS_mountMemory(buf, len, freeBuf, args, mntpoint, appending);
    } /* else */

    if (rc)
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}